

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::iterate(TextureCubeShadowCase *this)

{
  float *pfVar1;
  pointer pfVar2;
  ulong uVar3;
  int *piVar4;
  TestLog *log;
  RenderContext *context;
  pointer pFVar5;
  int y;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 dVar8;
  CompareMode CVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  undefined8 *puVar11;
  pointer pFVar12;
  size_t sVar13;
  long lVar14;
  NotSupportedError *this_00;
  char *pcVar15;
  CubeFace face;
  qpTestResult testResult;
  ulong uVar16;
  TestContext *pTVar17;
  uint uVar18;
  void *pvVar19;
  Surface result;
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport viewport;
  TexComparePrecision local_2e8;
  LodPrecision lodPrecision;
  undefined4 uStack_2b4;
  ulong local_2b0 [2];
  TextureFormat local_2a0;
  PixelFormat pixelFormat;
  ulong local_288 [3];
  long local_270;
  ScopedLogSection iterSection;
  ReferenceParams sampleParams;
  undefined1 local_1b0 [8];
  undefined1 auStack_1a8 [112];
  ios_base local_138 [264];
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar7);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar18 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar18 = (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar10,0x1c,0x1c,uVar18 >> 0xf ^ dVar8 ^ uVar18);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  piVar4 = local_2e8.uvwBits.m_data + 1;
  local_2e8.coordBits.m_data._0_8_ = piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x68));
  uVar3 = (long)result.m_pixels.m_ptr +
          CONCAT44(local_2e8.uvwBits.m_data[0],local_2e8.coordBits.m_data[2]);
  uVar16 = 0xf;
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar4) {
    uVar16 = CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]);
  }
  if (uVar16 < uVar3) {
    uVar16 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar16 = result.m_pixels.m_cap;
    }
    if (uVar16 < uVar3) goto LAB_01159fd3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&result,0,(char *)0x0,local_2e8.coordBits.m_data._0_8_);
  }
  else {
LAB_01159fd3:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_2e8,CONCAT44(result.m_height,result.m_width));
  }
  sampleParams.super_RenderParams._0_8_ = sampleParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar11 + 2);
  if ((float *)*puVar11 == pfVar1) {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams.w.m_data[3] = *(float *)(puVar11 + 3);
    sampleParams.super_RenderParams.bias = *(float *)((long)puVar11 + 0x1c);
  }
  else {
    sampleParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    sampleParams.super_RenderParams._0_8_ = (float *)*puVar11;
  }
  sampleParams.super_RenderParams._8_8_ = puVar11[1];
  *puVar11 = pfVar1;
  puVar11[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x68));
  uVar3 = CONCAT44(uStack_2b4,lodPrecision.lodBits) + pixelFormat._8_8_;
  uVar16 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_288) {
    uVar16 = local_288[0];
  }
  if (uVar16 < uVar3) {
    uVar16 = 0xf;
    if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_2b0) {
      uVar16 = local_2b0[0];
    }
    if (uVar3 <= uVar16) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&lodPrecision,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_0115a13e;
    }
  }
  puVar11 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&pixelFormat,CONCAT44(lodPrecision.derivateBits,lodPrecision.rule));
LAB_0115a13e:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar11 + 2);
  if ((pointer)*puVar11 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar11;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar11[1];
  *puVar11 = pfVar2;
  puVar11[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&iterSection,log,(string *)&sampleParams,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule) != local_2b0) {
    operator_delete((ulong *)CONCAT44(lodPrecision.derivateBits,lodPrecision.rule),local_2b0[0] + 1)
    ;
  }
  if ((ulong *)pixelFormat._0_8_ != local_288) {
    operator_delete((void *)pixelFormat._0_8_,local_288[0] + 1);
  }
  if ((float *)sampleParams.super_RenderParams._0_8_ != sampleParams.super_RenderParams.w.m_data + 1
     ) {
    operator_delete((void *)sampleParams.super_RenderParams._0_8_,
                    sampleParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar4) {
    operator_delete((void *)local_2e8.coordBits.m_data._0_8_,
                    CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]) + 1);
  }
  pFVar12 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
               ,0x25f);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar14 + 0xb8))(0x8513,pFVar12->texture->m_glTexture);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x884c,0x884e);
  (**(code **)(lVar14 + 0x1360))(0x8513,0x884d,this->m_compareFunc);
  (**(code **)(lVar14 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)local_1b0,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  sampleParams.sampler.magFilter = auStack_1a8._8_4_;
  sampleParams.sampler.lodThreshold = (float)auStack_1a8._12_4_;
  sampleParams.sampler.normalizedCoords = (bool)auStack_1a8[0x10];
  sampleParams.sampler._25_3_ = auStack_1a8._17_3_;
  sampleParams.sampler.compare = auStack_1a8._20_4_;
  sampleParams.sampler.wrapS = local_1b0._0_4_;
  sampleParams.sampler.wrapT = local_1b0._4_4_;
  sampleParams.sampler.wrapR = auStack_1a8._0_4_;
  sampleParams.sampler.minFilter = auStack_1a8._4_4_;
  sampleParams.sampler._32_8_ = auStack_1a8._24_8_;
  sampleParams.sampler.borderColor.v.uData[1] = auStack_1a8._32_4_;
  sampleParams.sampler.borderColor.v._8_8_ = auStack_1a8._36_8_;
  sampleParams.sampler._53_7_ = SUB87(auStack_1a8._44_8_,1);
  sampleParams.sampler.seamlessCubeMap = true;
  CVar9 = glu::mapGLCompareFunc(this->m_compareFunc);
  sampleParams.sampler.compare = CVar9;
  sampleParams.super_RenderParams.samplerType = SAMPLERTYPE_SHADOW;
  sampleParams.lodMode = LODMODE_EXACT;
  sampleParams.super_RenderParams.ref = pFVar12->ref;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  local_270 = lVar14;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_1a8,"Compare reference value =  ",0x1b);
  std::ostream::_M_insert<double>((double)sampleParams.super_RenderParams.ref);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)auStack_1a8,&pFVar12->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8," -> ",4);
  tcu::operator<<((ostream *)auStack_1a8,&pFVar12->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  std::ios_base::~ios_base(local_138);
  face = CUBEFACE_NEGATIVE_X;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar12->bottomLeft,&pFVar12->topRight);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,"Face ",5);
    switch(face) {
    case CUBEFACE_NEGATIVE_X:
      bVar6 = false;
      pcVar15 = "-X";
      break;
    case CUBEFACE_POSITIVE_X:
      bVar6 = false;
      pcVar15 = "+X";
      break;
    case CUBEFACE_NEGATIVE_Y:
      bVar6 = false;
      pcVar15 = "-Y";
      break;
    case CUBEFACE_POSITIVE_Y:
      bVar6 = false;
      pcVar15 = "+Y";
      break;
    case CUBEFACE_NEGATIVE_Z:
      bVar6 = false;
      pcVar15 = "-Z";
      break;
    case CUBEFACE_POSITIVE_Z:
      bVar6 = false;
      pcVar15 = "+Z";
      break;
    default:
      bVar6 = true;
      pcVar15 = (char *)0x0;
    }
    if (bVar6) {
      std::ios::clear((int)auStack_1a8 + (int)*(_func_int **)(auStack_1a8._0_8_ + -0x18));
    }
    else {
      sVar13 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar15,sVar13);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
    std::ios_base::~ios_base(local_138);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    dVar8 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x288);
    y = viewport.y;
    iVar7 = viewport.x;
    context = ((this->super_TestCase).m_context)->m_renderCtx;
    local_2e8.coordBits.m_data[0] = 8;
    local_2e8.coordBits.m_data[1] = 3;
    pvVar19 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar19 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,result.m_width,
               result.m_height,1,pvVar19);
    glu::readPixels(context,iVar7,y,(PixelBufferAccess *)local_1b0);
    dVar8 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar8,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x28b);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pixelFormat.redBits = (pRVar10->m_pixelFormat).redBits;
    pixelFormat.greenBits = (pRVar10->m_pixelFormat).greenBits;
    pixelFormat.blueBits = (pRVar10->m_pixelFormat).blueBits;
    pixelFormat.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
    lodPrecision.rule = RULE_OPENGL;
    lVar14 = 0;
    do {
      local_2e8.coordBits.m_data[lVar14] = 0x16;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar14 = 3;
    do {
      local_2e8.coordBits.m_data[lVar14] = 0x10;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    local_2e8.coordBits.m_data._0_8_ = (int *)0xa0000000a;
    local_2e8.coordBits.m_data[2] = 10;
    local_2e8.uvwBits.m_data[0] = 6;
    local_2e8.uvwBits.m_data[1] = 6;
    local_2e8.uvwBits.m_data[2] = 0;
    local_2e8.pcfBits = 5;
    local_2e8.referenceBits = 0x10;
    local_2e8.resultBits = pixelFormat.redBits + -1;
    pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_2a0.order = RGBA;
    local_2a0.type = UNORM_INT8;
    pvVar19 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar19 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_2a0,result.m_width,result.m_height,1,pvVar19);
    bVar6 = verifyTexCompareResult<tcu::TextureCube>
                      (pTVar17,(ConstPixelBufferAccess *)local_1b0,&pFVar12->texture->m_refTexture,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&sampleParams,&local_2e8,&lodPrecision,
                       &pixelFormat);
    if (!bVar6) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_1a8,
                 "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
      std::ios_base::~ios_base(local_138);
      lodPrecision.lodBits = 4;
      local_2e8.uvwBits.m_data[0] = 4;
      local_2e8.uvwBits.m_data[1] = 4;
      local_2e8.uvwBits.m_data[2] = 0;
      local_2e8.pcfBits = 0;
      pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      local_2a0.order = RGBA;
      local_2a0.type = UNORM_INT8;
      pvVar19 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar19 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,&local_2a0,result.m_width,result.m_height,1,pvVar19)
      ;
      bVar6 = verifyTexCompareResult<tcu::TextureCube>
                        (pTVar17,(ConstPixelBufferAccess *)local_1b0,&pFVar12->texture->m_refTexture
                         ,texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,&local_2e8,&lodPrecision,
                         &pixelFormat);
      if (bVar6) {
        pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (pTVar17->m_testResult != QP_TEST_RESULT_PASS) goto LAB_0115a9cc;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        pcVar15 = "Low-quality result";
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1a8,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar17 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        pcVar15 = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar17,testResult,pcVar15);
    }
LAB_0115a9cc:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    if (face == CUBEFACE_LAST) {
      iVar7 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar7;
      pFVar12 = (this->m_cases).
                super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar5 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(iterSection.m_log);
      return (IterateResult)(iVar7 < (int)((ulong)((long)pFVar5 - (long)pFVar12) >> 5));
    }
  } while( true );
}

Assistant:

TextureCubeShadowCase::IterateResult TextureCubeShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	m_testCtx.getLog()
		<< TestLog::Message
		<< "Compare reference value =  " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}